

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O0

void __thiscall OpenMD::SwitchingFunction::SwitchingFunction(SwitchingFunction *this)

{
  shared_ptr<OpenMD::CubicSpline> *in_RDI;
  shared_ptr<OpenMD::CubicSpline> *this_00;
  
  *(undefined4 *)
   &in_RDI[2].super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 5)
       = 1;
  *(undefined4 *)
   &in_RDI[2].super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = 0x96;
  this_00 = in_RDI + 3;
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3ba4e6);
  std::make_shared<OpenMD::CubicSpline>();
  std::shared_ptr<OpenMD::CubicSpline>::operator=(this_00,in_RDI);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3ba50e);
  return;
}

Assistant:

SwitchingFunction::SwitchingFunction() :
      functionType_(cubic), haveSpline_(false), isCubic_(true), np_(150) {
    switchSpline_ = std::make_shared<CubicSpline>();
  }